

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O1

CuboidMedium<pbrt::NanoVDBMediumProvider> *
pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>::Create
          (NanoVDBMediumProvider *provider,ParameterDictionary *parameters,
          Transform *renderFromMedium,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SpectrumHandle sig_s;
  SpectrumHandle sig_a;
  string preset;
  string local_c0;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_a0;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_98;
  Float local_90;
  Float local_8c;
  undefined1 local_88 [40];
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_98.bits = 0;
  local_a0.bits = 0;
  paVar1 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  local_88._32_8_ = renderFromMedium;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"preset","");
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"");
  ParameterDictionary::GetOneString((string *)local_60,parameters,&local_c0,(string *)local_88);
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,
                    (ulong)((long)&(((string *)local_88._16_8_)->_M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  if ((ParsedParameter *)local_60._8_8_ != (ParsedParameter *)0x0) {
    bVar3 = GetMediumScatteringProperties
                      ((string *)local_60,(SpectrumHandle *)&local_98,(SpectrumHandle *)&local_a0,
                       alloc);
    if (!bVar3) {
      local_c0._M_string_length = 0;
      local_c0.field_2._M_local_buf[0] = '\0';
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      detail::stringPrintfRecursive<std::__cxx11::string&>
                (&local_c0,"Material preset \"%s\" not found.",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      Warning(loc,local_c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                 local_c0.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  if ((pointer)local_98.bits == (pointer)0x0) {
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"sigma_a","");
    local_40._8_8_ = 0;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)local_88,(string *)parameters,(SpectrumHandle *)&local_c0,
               (int)&local_40 + 8,(Allocator)0x1);
    uVar2 = local_88._0_8_;
    local_98.bits = local_88._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    if ((pointer)uVar2 == (pointer)0x0) {
      iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
      *(undefined4 *)CONCAT44(extraout_var,iVar4) = 0x3f800000;
      local_98.bits = CONCAT44(extraout_var,iVar4) | 0x1000000000000;
    }
  }
  if ((pointer)local_a0.bits == (pointer)0x0) {
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"sigma_s","");
    local_40._M_allocated_capacity = 0;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)local_88,(string *)parameters,(SpectrumHandle *)&local_c0,
               (SpectrumType)&local_40,(Allocator)0x1);
    uVar2 = local_88._0_8_;
    local_a0.bits = local_88._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    if ((pointer)uVar2 == (pointer)0x0) {
      iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
      *(undefined4 *)CONCAT44(extraout_var_00,iVar4) = 0x3f800000;
      local_a0.bits = CONCAT44(extraout_var_00,iVar4) | 0x1000000000000;
    }
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"scale","");
  local_8c = ParameterDictionary::GetOneFloat(parameters,&local_c0,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"g","");
  local_90 = ParameterDictionary::GetOneFloat(parameters,&local_c0,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x128,8);
  local_c0._M_dataplus._M_p = (pointer)local_98.bits;
  local_88._0_8_ = local_a0.bits;
  CuboidMedium((CuboidMedium<pbrt::NanoVDBMediumProvider> *)CONCAT44(extraout_var_01,iVar4),provider
               ,(SpectrumHandle *)&local_c0,(SpectrumHandle *)local_88,local_8c,local_90,
               (Transform *)local_88._32_8_,alloc);
  if ((ParsedParameter *)local_60._0_8_ != (ParsedParameter *)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  return (CuboidMedium<pbrt::NanoVDBMediumProvider> *)CONCAT44(extraout_var_01,iVar4);
}

Assistant:

static CuboidMedium<Provider> *Create(const Provider *provider,
                                          const ParameterDictionary &parameters,
                                          const Transform &renderFromMedium,
                                          const FileLoc *loc, Allocator alloc) {
        SpectrumHandle sig_a = nullptr, sig_s = nullptr;
        std::string preset = parameters.GetOneString("preset", "");
        if (!preset.empty()) {
            if (!GetMediumScatteringProperties(preset, &sig_a, &sig_s, alloc))
                Warning(loc, "Material preset \"%s\" not found.", preset);
        }

        if (sig_a == nullptr) {
            sig_a = parameters.GetOneSpectrum("sigma_a", nullptr, SpectrumType::Unbounded,
                                              alloc);
            if (sig_a == nullptr)
                sig_a = alloc.new_object<ConstantSpectrum>(1.f);
        }
        if (sig_s == nullptr) {
            sig_s = parameters.GetOneSpectrum("sigma_s", nullptr, SpectrumType::Unbounded,
                                              alloc);
            if (sig_s == nullptr)
                sig_s = alloc.new_object<ConstantSpectrum>(1.f);
        }

        Float sigScale = parameters.GetOneFloat("scale", 1.f);

        Float g = parameters.GetOneFloat("g", 0.0f);

        return alloc.new_object<CuboidMedium<Provider>>(provider, sig_a, sig_s, sigScale,
                                                        g, renderFromMedium, alloc);
    }